

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void __thiscall
so_5::disp::prio_one_thread::strictly_ordered::impl::
dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
::disp_data_source_t::distribute(disp_data_source_t *this,mbox_t *mbox)

{
  dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
  *pdVar1;
  undefined1 auVar2 [16];
  size_t agents_count;
  id in_stack_ffffffffffffff90;
  suffix_t local_68;
  work_thread_activity_stats_t local_60;
  
  local_60.m_working_stats.m_avg_time.__r = (rep)&stack0xffffffffffffff88;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_stack_ffffffffffffff90._M_thread;
  local_60.m_working_stats.m_count = (uint_fast64_t)this;
  local_60.m_working_stats.m_total_time.__r = (rep)mbox;
  prio::
  for_each_priority<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t::handle_stats_for_each_prio<so_5::disp::prio_one_thread::strictly_ordered::impl::dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>>::disp_data_source_t::distribute(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&)::_lambda(so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t::queue_stats_t_const&)_1_>(so_5::disp::prio_one_thread::strictly_ordered::impl::dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>>::disp_data_source_t::distribute(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&)::_lambda(so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t::queue_stats_t_const&)_1_)::_lambda(so_5::priority_t)_1_>
            ((anon_class_16_2_f77679f7)(auVar2 << 0x40));
  local_60.m_working_stats.m_count = (uint_fast64_t)stats::suffixes::agent_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long&>
            (mbox,&this->m_base_prefix,(suffix_t *)&local_60,
             (unsigned_long *)&stack0xffffffffffffff88);
  pdVar1 = this->m_dispatcher;
  local_68 = stats::suffixes::work_thread_activity();
  reuse::work_thread_details::
  with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
  ::take_activity_stats
            (&local_60,
             &(pdVar1->m_work_thread).
              super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
            );
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::work_thread_activity,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
            (mbox,&this->m_base_prefix,&local_68,(id *)&stack0xffffffffffffff90,&local_60);
  return;
}

Assistant:

virtual void
				distribute( const mbox_t & mbox ) override
					{
						std::size_t agents_count = 0;

						m_dispatcher.m_demand_queue.handle_stats_for_each_prio(
							[&]( const demand_queue_t::queue_stats_t & stat ) {
								distribute_value_for_priority(
									mbox,
									stat.m_priority,
									stat.m_agents_count,
									stat.m_demands_count );

								agents_count += stat.m_agents_count;
							} );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								m_base_prefix,
								stats::suffixes::agent_count(),
								agents_count );

						send_thread_activity_stats(
								mbox,
								m_base_prefix,
								m_dispatcher.m_work_thread );
					}